

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::multiplyBy
          (DecimalQuantity *this,DecNum *multiplicand,UErrorCode *status)

{
  int iVar1;
  DecNum decnum;
  DecNum local_80;
  
  iVar1 = (*(this->super_IFixedDecimal)._vptr_IFixedDecimal[4])();
  if (((char)iVar1 == '\0') && (this->precision != 0)) {
    iVar1 = (*(this->super_IFixedDecimal)._vptr_IFixedDecimal[3])(this);
    if ((char)iVar1 == '\0') {
      DecNum::DecNum(&local_80);
      toDecNum(this,&local_80,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        DecNum::multiplyBy(&local_80,multiplicand,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          setBcdToZero(this);
          this->flags = '\0';
          _setToDecNum(this,&local_80,status);
        }
      }
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&local_80.fData);
    }
  }
  return;
}

Assistant:

void DecimalQuantity::multiplyBy(const DecNum& multiplicand, UErrorCode& status) {
    if (isInfinite() || isZero() || isNaN()) {
        return;
    }
    // Convert to DecNum, multiply, and convert back.
    DecNum decnum;
    toDecNum(decnum, status);
    if (U_FAILURE(status)) { return; }
    decnum.multiplyBy(multiplicand, status);
    if (U_FAILURE(status)) { return; }
    setToDecNum(decnum, status);
}